

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

uint __thiscall QPDFWriter::bytesNeeded(QPDFWriter *this,longlong n)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (n != 0) {
    do {
      uVar2 = uVar2 + 1;
      bVar1 = 0xff < (ulong)n;
      n = n >> 8;
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

unsigned int
QPDFWriter::bytesNeeded(long long n)
{
    unsigned int bytes = 0;
    while (n) {
        ++bytes;
        n >>= 8;
    }
    return bytes;
}